

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseScript(Parser *this)

{
  bool bVar1;
  
  ParseLibraryImports(this);
  ParseLibraryDeclaration(this);
  while (((this->m_currentSymbol)._M_current !=
          (this->m_symbolList->
          super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
          super__Vector_impl_data._M_finish && (this->m_error == false))) {
    ParseStatement(this);
  }
  if (this->m_breakAddress != 0) {
    Error<>(this,"Illegal break");
  }
  EmitOpcode(this,Exit);
  WriteBytecodeHeader(this);
  bVar1 = EnableDebugInfo();
  if (bVar1) {
    WriteDebugInfo(this);
    return;
  }
  return;
}

Assistant:

inline_t void Parser::ParseScript()
	{
		ParseLibraryImports();
		ParseLibraryDeclaration();
		while (m_currentSymbol != m_symbolList.end() && !m_error)
			ParseStatement();
		if (m_breakAddress)
			Error("Illegal break");
		EmitOpcode(Opcode::Exit);
		WriteBytecodeHeader();
		if (EnableDebugInfo())
			WriteDebugInfo();
	}